

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_array_reduce(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int special)

{
  int *piVar1;
  JSValue new_target;
  long lVar2;
  int iVar3;
  JSRefCountHeader *p_1;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int64_t iVar7;
  JSRefCountHeader *p_2;
  JSValueUnion JVar8;
  long lVar9;
  JSRefCountHeader *p;
  JSValueUnion JVar10;
  long lVar11;
  ulong uVar12;
  ulong idx;
  int64_t iVar13;
  bool bVar14;
  JSValue obj;
  JSValue func_obj;
  JSValue JVar15;
  JSValue JVar16;
  JSValue v;
  JSValue JVar17;
  JSValue JVar18;
  JSRefCountHeader *p_3;
  int64_t len;
  JSValueUnion local_e0;
  int64_t iStack_d8;
  JSValueUnion local_d0;
  int64_t iStack_c8;
  uint local_bc;
  JSValueUnion local_b8;
  long local_b0;
  int64_t local_a8;
  int64_t local_a0;
  JSValueUnion local_98;
  ulong local_90;
  undefined4 local_88;
  uint uStack_84;
  undefined8 uStack_80;
  JSValueUnion local_78;
  int64_t iStack_70;
  JSValueUnion local_68;
  int64_t iStack_60;
  double local_58;
  undefined8 local_50;
  JSValueUnion local_48;
  int64_t local_40;
  
  local_e0.ptr = (void *)(local_e0 << 0x20);
  iStack_d8 = 3;
  local_d0.ptr = (void *)(local_d0 << 0x20);
  iStack_c8 = 3;
  local_bc = special;
  if ((special & 8U) == 0) {
    this_val = JS_ToObject(ctx,this_val);
    iVar3 = js_get_length64(ctx,&local_b0,this_val);
    if (iVar3 == 0) {
LAB_00161d60:
      iVar7 = this_val.tag;
      JVar10 = this_val.u;
      JVar8 = (JSValueUnion)(argv->u).ptr;
      iVar13 = argv->tag;
      iVar3 = check_function(ctx,*argv);
      lVar2 = local_b0;
      if (iVar3 == 0) {
        local_a0 = iVar13;
        local_98 = JVar8;
        if (argc < 2) {
          lVar11 = 0;
          lVar9 = 0;
          if (0 < local_b0) {
            lVar9 = local_b0;
          }
          lVar5 = -1;
          do {
            lVar4 = lVar5;
            if (lVar9 == lVar11) {
              JS_ThrowTypeError(ctx,"empty array");
              goto LAB_001620b0;
            }
            lVar5 = lVar4 + lVar2;
            if ((local_bc & 1) == 0) {
              lVar5 = lVar11;
            }
            if ((local_bc & 8) != 0) {
              _local_e0 = JS_GetPropertyInt64(ctx,this_val,lVar5);
              if (local_e0._8_4_ == 6) goto LAB_001620ab;
              break;
            }
            iVar3 = JS_TryGetPropertyInt64(ctx,this_val,lVar5,(JSValue *)&local_e0);
            if (iVar3 < 0) goto LAB_001620ab;
            lVar11 = lVar11 + 1;
            lVar5 = lVar4 + -1;
          } while (iVar3 == 0);
          uVar6 = -lVar4;
        }
        else {
          piVar1 = (int *)argv[1].u.ptr;
          _local_e0 = argv[1];
          if (0xfffffff4 < (uint)argv[1].tag) {
            *piVar1 = *piVar1 + 1;
          }
          uVar6 = 0;
        }
        if ((long)uVar6 < lVar2) {
          uVar12 = ~uVar6 + lVar2;
          local_a8 = iVar7;
          JVar15 = _local_e0;
          do {
            local_b8 = JVar15.u;
            idx = uVar12;
            if ((local_bc & 1) == 0) {
              idx = uVar6;
            }
            local_90 = uVar6;
            if ((local_bc & 8) == 0) {
              JVar16.tag = iVar7;
              JVar16.u.ptr = JVar10.ptr;
              iVar3 = JS_TryGetPropertyInt64(ctx,JVar16,idx,(JSValue *)&local_d0);
              JVar17.tag = JVar15.tag;
              JVar17.u.ptr = local_b8.ptr;
              if (iVar3 < 0) goto LAB_001620ab;
              JVar16 = _local_e0;
              if (iVar3 != 0) goto LAB_00161ed1;
            }
            else {
              obj.tag = iVar7;
              obj.u.ptr = JVar10.ptr;
              _local_d0 = JS_GetPropertyInt64(ctx,obj,idx);
              if (local_d0._8_4_ == 6) goto LAB_001620ab;
LAB_00161ed1:
              JVar16 = _local_d0;
              JVar8 = local_d0;
              bVar14 = (long)(int)idx == idx;
              local_58 = (double)(long)idx;
              if (bVar14) {
                local_58 = (double)(idx & 0xffffffff);
              }
              local_50 = 7;
              if (bVar14) {
                local_50 = 0;
              }
              local_78 = local_e0;
              iStack_70 = iStack_d8;
              iStack_60 = iStack_c8;
              local_88 = 0;
              uStack_80 = 3;
              new_target.tag = 3;
              new_target.u.ptr = (void *)((ulong)uStack_84 << 0x20);
              func_obj.tag = local_a0;
              func_obj.u.float64 = local_98.float64;
              local_68 = JVar8;
              local_48 = JVar10;
              local_40 = iVar7;
              JVar17 = JS_CallInternal(ctx,func_obj,(JSValue)(ZEXT816(3) << 0x40),new_target,4,
                                       (JSValue *)&local_78,2);
              if ((0xfffffff4 < (uint)JVar16.tag) &&
                 (iVar3 = *JVar8.ptr, *(int *)JVar8.ptr = iVar3 + -1, iVar3 < 2)) {
                __JS_FreeValueRT(ctx->rt,JVar16);
              }
              local_d0.ptr = (void *)(local_d0 << 0x20);
              iStack_c8 = 3;
              iVar7 = local_a8;
              if ((int)JVar17.tag == 6) goto LAB_001620ab;
              JVar16 = JVar17;
              if ((0xfffffff4 < (uint)JVar15.tag) &&
                 (iVar3 = *local_b8.ptr, *(int *)local_b8.ptr = iVar3 + -1, iVar3 < 2)) {
                JVar15.tag = JVar15.tag;
                JVar15.u.ptr = local_b8.ptr;
                __JS_FreeValueRT(ctx->rt,JVar15);
                iVar7 = local_a8;
              }
            }
            _local_e0 = JVar16;
            local_b8 = JVar17.u;
            uVar6 = local_90 + 1;
            bVar14 = uVar12 != 0;
            uVar12 = uVar12 - 1;
            JVar15 = JVar17;
          } while (bVar14);
        }
        if ((0xfffffff4 < (uint)iVar7) &&
           (iVar3 = *JVar10.ptr, *(int *)JVar10.ptr = iVar3 + -1, iVar3 < 2)) {
          v.tag = iVar7;
          v.u.ptr = JVar10.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        iVar13 = iStack_d8;
        goto LAB_00162122;
      }
    }
  }
  else {
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)this_val.u.ptr = *this_val.u.ptr + 1;
    }
    iVar3 = js_typed_array_get_length_internal(ctx,this_val);
    local_b0 = (long)iVar3;
    if (-1 < iVar3) goto LAB_00161d60;
  }
  goto LAB_001620b0;
LAB_001620ab:
  this_val.tag = iVar7;
  this_val.u.ptr = JVar10.ptr;
LAB_001620b0:
  if (0xfffffff4 < local_e0._8_4_) {
    iVar3 = *local_e0.ptr;
    *(int *)local_e0.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_e0);
    }
  }
  if (0xfffffff4 < local_d0._8_4_) {
    iVar3 = *local_d0.ptr;
    *(int *)local_d0.ptr = iVar3 + -1;
    if (iVar3 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_d0);
    }
  }
  iVar13 = 6;
  if ((0xfffffff4 < (uint)this_val.tag) &&
     (iVar3 = *this_val.u.ptr, *(int *)this_val.u.ptr = iVar3 + -1, iVar3 < 2)) {
    __JS_FreeValueRT(ctx->rt,this_val);
  }
  local_e0.float64 = 0.0;
LAB_00162122:
  JVar18.tag = iVar13;
  JVar18.u.float64 = local_e0.float64;
  return JVar18;
}

Assistant:

static JSValue js_array_reduce(JSContext *ctx, JSValueConst this_val,
                               int argc, JSValueConst *argv, int special)
{
    JSValue obj, val, index_val, acc, acc1;
    JSValueConst args[4];
    JSValueConst func;
    int64_t len, k, k1;
    int present;

    acc = JS_UNDEFINED;
    val = JS_UNDEFINED;
    if (special & special_TA) {
        obj = JS_DupValue(ctx, this_val);
        len = js_typed_array_get_length_internal(ctx, obj);
        if (len < 0)
            goto exception;
    } else {
        obj = JS_ToObject(ctx, this_val);
        if (js_get_length64(ctx, &len, obj))
            goto exception;
    }
    func = argv[0];

    if (check_function(ctx, func))
        goto exception;

    k = 0;
    if (argc > 1) {
        acc = JS_DupValue(ctx, argv[1]);
    } else {
        for(;;) {
            if (k >= len) {
                JS_ThrowTypeError(ctx, "empty array");
                goto exception;
            }
            k1 = (special & special_reduceRight) ? len - k - 1 : k;
            k++;
            if (special & special_TA) {
                acc = JS_GetPropertyInt64(ctx, obj, k1);
                if (JS_IsException(acc))
                    goto exception;
                break;
            } else {
                present = JS_TryGetPropertyInt64(ctx, obj, k1, &acc);
                if (present < 0)
                    goto exception;
                if (present)
                    break;
            }
        }
    }
    for (; k < len; k++) {
        k1 = (special & special_reduceRight) ? len - k - 1 : k;
        if (special & special_TA) {
            val = JS_GetPropertyInt64(ctx, obj, k1);
            if (JS_IsException(val))
                goto exception;
            present = TRUE;
        } else {
            present = JS_TryGetPropertyInt64(ctx, obj, k1, &val);
            if (present < 0)
                goto exception;
        }
        if (present) {
            index_val = JS_NewInt64(ctx, k1);
            if (JS_IsException(index_val))
                goto exception;
            args[0] = acc;
            args[1] = val;
            args[2] = index_val;
            args[3] = obj;
            acc1 = JS_Call(ctx, func, JS_UNDEFINED, 4, args);
            JS_FreeValue(ctx, index_val);
            JS_FreeValue(ctx, val);
            val = JS_UNDEFINED;
            if (JS_IsException(acc1))
                goto exception;
            JS_FreeValue(ctx, acc);
            acc = acc1;
        }
    }
    JS_FreeValue(ctx, obj);
    return acc;

exception:
    JS_FreeValue(ctx, acc);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}